

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O2

void __thiscall Storage::Tape::UEF::queue_carrier_tone_with_dummy(UEF *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = gzget16(this->file_);
  iVar2 = gzget16(this->file_);
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    queue_bit(this,1);
  }
  queue_implicit_byte(this,0xaa);
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    queue_bit(this,1);
  }
  return;
}

Assistant:

void UEF::queue_carrier_tone_with_dummy() {
	unsigned int pre_cycles = unsigned(gzget16(file_));
	unsigned int post_cycles = unsigned(gzget16(file_));
	while(pre_cycles--) queue_bit(1);
	queue_implicit_byte(0xaa);
	while(post_cycles--) queue_bit(1);
}